

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::LoopConstraint::appendConstraintAxis
          (LoopConstraint *this,SpatialVector *constraintAxis,bool positionLevelConstraint,
          bool velocityLevelConstraint)

{
  uint *puVar1;
  
  this->dblA = 2.220446049250313e-15;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &(this->super_Constraint).field_0xd8,constraintAxis);
  std::vector<bool,_std::allocator<bool>_>::push_back
            (&(this->super_Constraint).positionConstraint,positionLevelConstraint);
  std::vector<bool,_std::allocator<bool>_>::push_back
            (&(this->super_Constraint).velocityConstraint,velocityLevelConstraint);
  puVar1 = &(this->super_Constraint).sizeOfConstraint;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void LoopConstraint::
        appendConstraintAxis( const Math::SpatialVector &constraintAxis,
                              bool positionLevelConstraint,
                              bool velocityLevelConstraint)
{

  dblA = 10.0*std::numeric_limits<double>::epsilon();

  //Make sure the normal is valid
#ifndef RBDL_USE_CASADI_MATH
  assert( std::fabs(constraintAxis.norm()-1.) < dblA);
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    assert(std::fabs(T[i].dot(constraintAxis)) <= dblA);
  }
#endif

  T.push_back(constraintAxis);
  positionConstraint.push_back(positionLevelConstraint);
  velocityConstraint.push_back(velocityLevelConstraint);
  sizeOfConstraint++;

  assert(sizeOfConstraint <= 6 && sizeOfConstraint > 0);
}